

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask17_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = *in;
  *out = uVar2;
  uVar1 = in[1];
  *out = uVar1 << 0x11 | uVar2;
  uVar1 = uVar1 >> 0xf;
  out[1] = uVar1;
  uVar1 = in[2] << 2 | uVar1;
  out[1] = uVar1;
  uVar2 = in[3];
  out[1] = uVar2 << 0x13 | uVar1;
  uVar2 = uVar2 >> 0xd;
  out[2] = uVar2;
  uVar2 = in[4] << 4 | uVar2;
  out[2] = uVar2;
  uVar1 = in[5];
  out[2] = uVar1 << 0x15 | uVar2;
  uVar1 = uVar1 >> 0xb;
  out[3] = uVar1;
  uVar1 = in[6] << 6 | uVar1;
  out[3] = uVar1;
  uVar2 = in[7];
  out[3] = uVar2 << 0x17 | uVar1;
  out[4] = uVar2 >> 9;
  return out + 5;
}

Assistant:

uint32_t *__fastpackwithoutmask17_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 17;
  ++out;
  *out = ((*in)) >> (17 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (17 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 21;
  ++out;
  *out = ((*in)) >> (17 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (17 - 8);
  ++in;

  return out + 1;
}